

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.cpp
# Opt level: O0

bool Diligent::VerifyAliasingBarrierDesc(StateTransitionDesc *Barrier)

{
  STATE_TRANSITION_FLAGS SVar1;
  Char *pCVar2;
  char (*in_RCX) [132];
  undefined1 local_a0 [8];
  string msg_3;
  string msg_2;
  string msg_1;
  RESOURCE_DIMENSION AfterDim;
  RESOURCE_DIMENSION BeforeDim;
  anon_class_1_0_00000001 VerifySparseAliasedResource;
  undefined1 local_30 [8];
  string msg;
  StateTransitionDesc *Barrier_local;
  
  msg.field_2._8_8_ = Barrier;
  SVar1 = operator&(Barrier->Flags,STATE_TRANSITION_FLAG_ALIASING);
  if (SVar1 == STATE_TRANSITION_FLAG_NONE) {
    FormatString<char[26],char[47]>
              ((string *)local_30,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"Barrier.Flags & STATE_TRANSITION_FLAG_ALIASING",(char (*) [47])in_RCX
              );
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    in_RCX = (char (*) [132])0x1a6;
    DebugAssertionFailed
              (pCVar2,"VerifyAliasingBarrierDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x1a6);
    std::__cxx11::string::~string((string *)local_30);
  }
  msg_1.field_2._M_local_buf[10] =
       VerifyAliasingBarrierDesc::anon_class_1_0_00000001::operator()
                 ((anon_class_1_0_00000001 *)(msg_1.field_2._M_local_buf + 0xb),
                  *(IDeviceObject **)msg.field_2._8_8_);
  msg_1.field_2._M_local_buf[9] =
       VerifyAliasingBarrierDesc::anon_class_1_0_00000001::operator()
                 ((anon_class_1_0_00000001 *)(msg_1.field_2._M_local_buf + 0xb),
                  *(IDeviceObject **)(msg.field_2._8_8_ + 8));
  if (((msg_1.field_2._M_local_buf[10] != '\0') &&
      (msg_1.field_2._M_local_buf[9] != RESOURCE_DIM_UNDEFINED)) &&
     (in_RCX = (char (*) [132])(ulong)(msg_1.field_2._M_local_buf[9] == RESOURCE_DIM_BUFFER),
     (msg_1.field_2._M_local_buf[10] == '\x01') !=
     (msg_1.field_2._M_local_buf[9] == RESOURCE_DIM_BUFFER))) {
    FormatString<char[42],char[130]>
              ((string *)((long)&msg_2.field_2 + 8),
               (Diligent *)"State transition parameters are invalid: ",
               (char (*) [42])
               "Both before- and after-resources must either be buffers or textures. Sparse aliasing between textures and buffers is not allowed."
               ,(char (*) [130])in_RCX);
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    in_RCX = (char (*) [132])0x1cf;
    DebugAssertionFailed
              (pCVar2,"VerifyAliasingBarrierDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x1cf);
    std::__cxx11::string::~string((string *)(msg_2.field_2._M_local_buf + 8));
  }
  if ((*(int *)(msg.field_2._8_8_ + 0x20) != 0) || (*(int *)(msg.field_2._8_8_ + 0x24) != 0)) {
    FormatString<char[42],char[111]>
              ((string *)((long)&msg_3.field_2 + 8),
               (Diligent *)"State transition parameters are invalid: ",
               (char (*) [42])
               "Aliasing barrier does not support state transitions. OldState and NewState must both be RESOURCE_STATE_UNKNOWN"
               ,(char (*) [111])in_RCX);
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    in_RCX = (char (*) [132])0x1d3;
    DebugAssertionFailed
              (pCVar2,"VerifyAliasingBarrierDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x1d3);
    std::__cxx11::string::~string((string *)(msg_3.field_2._M_local_buf + 8));
  }
  if (((*(int *)(msg.field_2._8_8_ + 0x10) != 0) || (*(int *)(msg.field_2._8_8_ + 0x14) != -1)) ||
     ((*(int *)(msg.field_2._8_8_ + 0x18) != 0 || (*(int *)(msg.field_2._8_8_ + 0x1c) != -1)))) {
    FormatString<char[42],char[132]>
              ((string *)local_a0,(Diligent *)"State transition parameters are invalid: ",
               (char (*) [42])
               "Aliasing barrier is applied to all subresources. FirstMipLevel, MipLevelsCount, FirstArraySlice and ArraySliceCount must be default"
               ,in_RCX);
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar2,"VerifyAliasingBarrierDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x1d7);
    std::__cxx11::string::~string((string *)local_a0);
  }
  return true;
}

Assistant:

static bool VerifyAliasingBarrierDesc(const StateTransitionDesc& Barrier)
{
    VERIFY_EXPR(Barrier.Flags & STATE_TRANSITION_FLAG_ALIASING);

    auto VerifySparseAliasedResource = [](IDeviceObject* pResource) //
    {
        if (pResource == nullptr)
            return RESOURCE_DIM_UNDEFINED;

        if (RefCntAutoPtr<ITexture> pTexture{pResource, IID_Texture})
        {
            const TextureDesc& TexDesc = pTexture->GetDesc();
            DEV_CHECK_ERR(TexDesc.Usage == USAGE_SPARSE,
                          "Texture '", TexDesc.Name, "' used in an aliasing barrier is not a sparse resource");
            DEV_CHECK_ERR((TexDesc.MiscFlags & MISC_TEXTURE_FLAG_SPARSE_ALIASING) != 0,
                          "Texture '", TexDesc.Name, "' used in an aliasing barrier was not created with MISC_TEXTURE_FLAG_SPARSE_ALIASING flag");

            return TexDesc.Type;
        }
        else if (RefCntAutoPtr<IBuffer> pBuffer{pResource, IID_Buffer})
        {
            const BufferDesc& BuffDesc = pBuffer->GetDesc();

            DEV_CHECK_ERR(BuffDesc.Usage == USAGE_SPARSE,
                          "Buffer '", BuffDesc.Name, "' used in an aliasing barrier is not a sparse resource");
            DEV_CHECK_ERR((BuffDesc.MiscFlags & MISC_BUFFER_FLAG_SPARSE_ALIASING) != 0,
                          "Buffer '", BuffDesc.Name, "' used in an aliasing barrier was not created with MISC_BUFFER_FLAG_SPARSE_ALIASING flag");

            return RESOURCE_DIM_BUFFER;
        }
        else
        {
            DEV_ERROR("Only textures and buffers are allowed in aliasing barriers");
            return RESOURCE_DIM_UNDEFINED;
        }
    };

    RESOURCE_DIMENSION BeforeDim = VerifySparseAliasedResource(Barrier.pResourceBefore);
    RESOURCE_DIMENSION AfterDim  = VerifySparseAliasedResource(Barrier.pResource);
    if (BeforeDim != RESOURCE_DIM_UNDEFINED && AfterDim != RESOURCE_DIM_UNDEFINED)
    {
        CHECK_STATE_TRANSITION_DESC((BeforeDim == RESOURCE_DIM_BUFFER) == (AfterDim == RESOURCE_DIM_BUFFER),
                                    "Both before- and after-resources must either be buffers or textures. "
                                    "Sparse aliasing between textures and buffers is not allowed.");
    }

    CHECK_STATE_TRANSITION_DESC(Barrier.OldState == RESOURCE_STATE_UNKNOWN && Barrier.NewState == RESOURCE_STATE_UNKNOWN,
                                "Aliasing barrier does not support state transitions. OldState and NewState must both be RESOURCE_STATE_UNKNOWN");

    CHECK_STATE_TRANSITION_DESC((Barrier.FirstMipLevel == 0 && Barrier.MipLevelsCount == REMAINING_MIP_LEVELS &&
                                 Barrier.FirstArraySlice == 0 && Barrier.ArraySliceCount == REMAINING_ARRAY_SLICES),
                                "Aliasing barrier is applied to all subresources. FirstMipLevel, MipLevelsCount, FirstArraySlice and ArraySliceCount must be default");

    return true;
}